

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_examples.cpp
# Opt level: O3

void density_tests::
     LfQueueSamples<(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
     ::nonblocking_heterogeneous_queue_consume_operation_samples(void)

{
  LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
  *pLVar1;
  ControlBlock *pCVar2;
  uintptr_t uVar3;
  bool bVar4;
  bool bVar5;
  runtime_type<> *prVar6;
  void *i_dest;
  int *piVar7;
  int *piVar8;
  long *plVar9;
  consume_operation consume;
  LfQueue queue;
  Consume local_180;
  Consume local_160;
  LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
  local_140;
  Consume local_90 [4];
  
  local_140.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
  .m_tail = 0xffc0;
  local_140.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_140.m_head._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_180.m_next_ptr = 0;
  local_180.m_queue =
       (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
        *)0x0;
  local_180.m_control = (ControlBlock *)0x0;
  bVar4 = density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
          ::Consume::empty(&local_180);
  if (!bVar4) {
    __assert_fail("consume.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                  ,0x393,
                  "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_multiple, density::consistency_relaxed>::nonblocking_heterogeneous_queue_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple, CONSISTENCY_MODEL = density::consistency_relaxed]"
                 );
  }
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::consume_operation::~consume_operation((consume_operation *)&local_180);
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                     *)&local_140);
  local_140.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
  .m_tail = 0xffc0;
  local_140.
  super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_140.m_head._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_180.m_queue =
       (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
        *)CONCAT44(local_180.m_queue._4_4_,0x2a);
  density::
  lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>
  ::emplace<int,int>((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>
                      *)&local_140,(int *)&local_180);
  local_180.m_queue =
       (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
        *)0x0;
  local_180.m_control = (ControlBlock *)0x0;
  local_180.m_next_ptr = 0;
  density::detail::
  LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
  ::Consume::start_consume_impl(&local_180,&local_140);
  local_160.m_queue = local_180.m_queue;
  local_160.m_control = local_180.m_control;
  local_160.m_next_ptr = local_180.m_next_ptr;
  local_180.m_control = (ControlBlock *)0x0;
  local_180.m_next_ptr = 0;
  bVar4 = density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
          ::Consume::empty(&local_180);
  if (bVar4) {
    bVar4 = density::detail::
            LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
            ::Consume::empty(&local_160);
    if (!bVar4) {
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
      ::consume_operation::commit((consume_operation *)&local_160);
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
      ::consume_operation::~consume_operation((consume_operation *)&local_160);
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
      ::consume_operation::~consume_operation((consume_operation *)&local_180);
      density::
      lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
      ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                         *)&local_140);
      local_140.
      super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
      .m_tail = 0xffc0;
      local_140.
      super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
      .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
      local_140.m_head._M_b._M_p = (__base_type)(__pointer_type)0x0;
      local_180.m_queue._0_4_ = 0x2a;
      density::
      lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>
      ::emplace<int,int>((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>
                          *)&local_140,(int *)&local_180);
      local_180.m_queue =
           (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
            *)CONCAT44(local_180.m_queue._4_4_,0x2b);
      density::
      lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>
      ::emplace<int,int>((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>
                          *)&local_140,(int *)&local_180);
      local_180.m_next_ptr = 0;
      local_180.m_queue =
           (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
            *)0x0;
      local_180.m_control = (ControlBlock *)0x0;
      density::detail::
      LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
      ::Consume::start_consume_impl(&local_180,&local_140);
      local_160.m_control = local_180.m_control;
      local_160.m_queue = local_180.m_queue;
      local_180.m_queue =
           (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
            *)0x0;
      local_180.m_control = (ControlBlock *)0x0;
      local_160.m_next_ptr = local_180.m_next_ptr;
      local_180.m_next_ptr = 0;
      bVar4 = density::detail::
              LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
              ::Consume::empty(&local_180);
      if (bVar4) {
        bVar4 = density::detail::
                LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
                ::Consume::empty(&local_160);
        if (!bVar4) {
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          ::consume_operation::commit((consume_operation *)&local_160);
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          ::consume_operation::~consume_operation((consume_operation *)&local_160);
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          ::consume_operation::~consume_operation((consume_operation *)&local_180);
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                             *)&local_140);
          local_140.
          super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
          .m_tail = 0xffc0;
          local_140.
          super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
          .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
          local_140.m_head._M_b._M_p = (__base_type)(__pointer_type)0x0;
          local_180.m_queue._0_4_ = 0x2a;
          density::
          lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>
          ::emplace<int,int>((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>
                              *)&local_140,(int *)&local_180);
          local_90[0].m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
                *)0x0;
          local_90[0].m_control = (ControlBlock *)0x0;
          local_90[0].m_next_ptr = 0;
          density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
          ::Consume::start_consume_impl(local_90,&local_140);
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          ::consume_operation::~consume_operation((consume_operation *)local_90);
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                             *)&local_140);
          local_140.
          super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
          .m_tail = 0xffc0;
          local_140.
          super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
          .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
          local_140.m_head._M_b._M_p = (__base_type)(__pointer_type)0x0;
          local_180.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
                *)CONCAT44(local_180.m_queue._4_4_,0x2a);
          density::
          lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>
          ::emplace<int,int>((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>
                              *)&local_140,(int *)&local_180);
          local_180.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
                *)0x0;
          local_180.m_control = (ControlBlock *)0x0;
          local_180.m_next_ptr = 0;
          bVar4 = density::detail::
                  LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
                  ::Consume::empty(&local_180);
          if (!bVar4) {
            __assert_fail("consume.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                          ,0x3ec,
                          "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_multiple, density::consistency_relaxed>::nonblocking_heterogeneous_queue_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple, CONSISTENCY_MODEL = density::consistency_relaxed]"
                         );
          }
          local_160.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
                *)0x0;
          local_160.m_control = (ControlBlock *)0x0;
          local_160.m_next_ptr = 0;
          density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
          ::Consume::start_consume_impl(&local_160,&local_140);
          uVar3 = local_180.m_next_ptr;
          pCVar2 = local_180.m_control;
          pLVar1 = local_180.m_queue;
          local_180.m_queue = local_160.m_queue;
          local_180.m_control = local_160.m_control;
          local_160.m_queue = pLVar1;
          local_160.m_control = pCVar2;
          local_180.m_next_ptr = local_160.m_next_ptr;
          local_160.m_next_ptr = uVar3;
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          ::consume_operation::~consume_operation((consume_operation *)&local_160);
          bVar4 = density::detail::
                  LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
                  ::Consume::empty(&local_180);
          if (bVar4) {
            __assert_fail("!consume.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                          ,0x3ee,
                          "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_multiple, density::consistency_relaxed>::nonblocking_heterogeneous_queue_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple, CONSISTENCY_MODEL = density::consistency_relaxed]"
                         );
          }
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          ::consume_operation::~consume_operation((consume_operation *)&local_180);
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                             *)&local_140);
          local_140.
          super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
          .m_tail = 0xffc0;
          local_140.
          super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
          .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
          local_140.m_head._M_b._M_p = (__base_type)(__pointer_type)0x0;
          local_180.m_next_ptr = 0;
          local_180.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
                *)0x0;
          local_180.m_control = (ControlBlock *)0x0;
          bVar4 = density::detail::
                  LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
                  ::Consume::empty(&local_180);
          bVar5 = density::detail::
                  LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
                  ::Consume::empty(&local_180);
          if (bVar4 != bVar5) {
            __assert_fail("consume.empty() == !consume",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                          ,0x3fd,
                          "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_multiple, density::consistency_relaxed>::nonblocking_heterogeneous_queue_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple, CONSISTENCY_MODEL = density::consistency_relaxed]"
                         );
          }
          local_160.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
                *)0x0;
          local_160.m_control = (ControlBlock *)0x0;
          local_160.m_next_ptr = 0;
          density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
          ::Consume::start_consume_impl(&local_160,&local_140);
          uVar3 = local_180.m_next_ptr;
          pCVar2 = local_180.m_control;
          pLVar1 = local_180.m_queue;
          local_180.m_queue = local_160.m_queue;
          local_180.m_control = local_160.m_control;
          local_160.m_queue = pLVar1;
          local_160.m_control = pCVar2;
          local_180.m_next_ptr = local_160.m_next_ptr;
          local_160.m_next_ptr = uVar3;
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          ::consume_operation::~consume_operation((consume_operation *)&local_160);
          bVar4 = density::detail::
                  LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
                  ::Consume::empty(&local_180);
          bVar5 = density::detail::
                  LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
                  ::Consume::empty(&local_180);
          if (bVar4 != bVar5) {
            __assert_fail("consume.empty() == !consume",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                          ,0x3ff,
                          "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_multiple, density::consistency_relaxed>::nonblocking_heterogeneous_queue_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple, CONSISTENCY_MODEL = density::consistency_relaxed]"
                         );
          }
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          ::consume_operation::~consume_operation((consume_operation *)&local_180);
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                             *)&local_140);
          local_140.
          super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
          .m_tail = 0xffc0;
          local_140.
          super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
          .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
          local_140.m_head._M_b._M_p = (__base_type)(__pointer_type)0x0;
          density::
          lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>
          ::emplace<std::__cxx11::string,char_const(&)[4]>
                    ((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>
                      *)&local_140,(char (*) [4])"abc");
          local_180.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
                *)0x0;
          local_180.m_control = (ControlBlock *)0x0;
          local_180.m_next_ptr = 0;
          density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
          ::Consume::start_consume_impl(&local_180,&local_140);
          prVar6 = density::
                   lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                   ::consume_operation::complete_type((consume_operation *)&local_180);
          i_dest = density::
                   lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                   ::consume_operation::element_ptr((consume_operation *)&local_180);
          density::runtime_type<>::destroy(prVar6,i_dest);
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          ::consume_operation::commit_nodestroy((consume_operation *)&local_180);
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          ::consume_operation::~consume_operation((consume_operation *)&local_180);
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                             *)&local_140);
          local_140.
          super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
          .m_tail = 0xffc0;
          local_140.
          super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
          .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
          local_140.m_head._M_b._M_p = (__base_type)(__pointer_type)0x0;
          local_180.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
                *)CONCAT44(local_180.m_queue._4_4_,0x2a);
          density::
          lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>
          ::emplace<int,int>((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>
                              *)&local_140,(int *)&local_180);
          local_180.m_next_ptr = 0;
          local_180.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
                *)0x0;
          local_180.m_control = (ControlBlock *)0x0;
          density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
          ::Consume::start_consume_impl(&local_180,&local_140);
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          ::consume_operation::cancel((consume_operation *)&local_180);
          local_160.m_next_ptr = 0;
          local_160.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
                *)0x0;
          local_160.m_control = (ControlBlock *)0x0;
          density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
          ::Consume::start_consume_impl(&local_160,&local_140);
          piVar7 = density::
                   lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                   ::consume_operation::element<int>((consume_operation *)&local_160);
          if (*piVar7 != 0x2a) {
            __assert_fail("queue.try_start_consume().template element<int>() == 42",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                          ,0x425,
                          "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_multiple, density::consistency_relaxed>::nonblocking_heterogeneous_queue_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple, CONSISTENCY_MODEL = density::consistency_relaxed]"
                         );
          }
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          ::consume_operation::~consume_operation((consume_operation *)&local_160);
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          ::consume_operation::~consume_operation((consume_operation *)&local_180);
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                             *)&local_140);
          local_140.
          super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
          .m_tail = 0xffc0;
          local_140.
          super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
          .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
          local_140.m_head._M_b._M_p = (__base_type)(__pointer_type)0x0;
          local_180.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
                *)CONCAT44(local_180.m_queue._4_4_,0x2a);
          density::
          lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>
          ::emplace<int,int>((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>
                              *)&local_140,(int *)&local_180);
          local_180.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
                *)0x0;
          local_180.m_control = (ControlBlock *)0x0;
          local_180.m_next_ptr = 0;
          density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
          ::Consume::start_consume_impl(&local_180,&local_140);
          prVar6 = density::
                   lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                   ::consume_operation::complete_type((consume_operation *)&local_180);
          if (prVar6->m_feature_table !=
              (tuple_type *)
              density::detail::
              FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
              ::s_table) {
            __assert_fail("consume.complete_type().template is<int>()",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                          ,0x435,
                          "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_multiple, density::consistency_relaxed>::nonblocking_heterogeneous_queue_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple, CONSISTENCY_MODEL = density::consistency_relaxed]"
                         );
          }
          prVar6 = density::
                   lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                   ::consume_operation::complete_type((consume_operation *)&local_180);
          if (prVar6->m_feature_table !=
              (tuple_type *)
              density::detail::
              FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
              ::s_table) {
            __assert_fail("consume.complete_type() == runtime_type<>::make<int>()",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                          ,0x437,
                          "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_multiple, density::consistency_relaxed>::nonblocking_heterogeneous_queue_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple, CONSISTENCY_MODEL = density::consistency_relaxed]"
                         );
          }
          piVar7 = density::
                   lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                   ::consume_operation::element<int>((consume_operation *)&local_180);
          if (*piVar7 != 0x2a) {
            __assert_fail("consume.template element<int>() == 42",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                          ,0x438,
                          "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_multiple, density::consistency_relaxed>::nonblocking_heterogeneous_queue_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple, CONSISTENCY_MODEL = density::consistency_relaxed]"
                         );
          }
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          ::consume_operation::commit((consume_operation *)&local_180);
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          ::consume_operation::~consume_operation((consume_operation *)&local_180);
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                             *)&local_140);
          local_140.
          super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
          .m_tail = 0xffc0;
          local_140.
          super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
          .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
          local_140.m_head._M_b._M_p = (__base_type)(__pointer_type)0x0;
          local_180.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
                *)CONCAT44(local_180.m_queue._4_4_,0x2a);
          density::
          lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>
          ::emplace<int,int>((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>
                              *)&local_140,(int *)&local_180);
          local_180.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
                *)0x0;
          local_180.m_control = (ControlBlock *)0x0;
          local_180.m_next_ptr = 0;
          density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
          ::Consume::start_consume_impl(&local_180,&local_140);
          piVar7 = (int *)density::
                          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                          ::consume_operation::element_ptr((consume_operation *)&local_180);
          *piVar7 = *piVar7 + 1;
          piVar7 = density::
                   lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                   ::consume_operation::element<int>((consume_operation *)&local_180);
          if (*piVar7 != 0x2b) {
            __assert_fail("consume.template element<int>() == 43",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                          ,0x44a,
                          "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_multiple, density::consistency_relaxed>::nonblocking_heterogeneous_queue_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple, CONSISTENCY_MODEL = density::consistency_relaxed]"
                         );
          }
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          ::consume_operation::commit((consume_operation *)&local_180);
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          ::consume_operation::~consume_operation((consume_operation *)&local_180);
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                             *)&local_140);
          local_140.
          super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
          .m_tail = 0xffc0;
          local_140.
          super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
          .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
          local_140.m_head._M_b._M_p = (__base_type)(__pointer_type)0x0;
          local_180.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
                *)CONCAT44(local_180.m_queue._4_4_,0x2a);
          density::
          lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>
          ::emplace<int,int>((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>
                              *)&local_140,(int *)&local_180);
          local_180.m_next_ptr = 0;
          local_180.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
                *)0x0;
          local_180.m_control = (ControlBlock *)0x0;
          density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
          ::Consume::start_consume_impl(&local_180,&local_140);
          local_160.m_next_ptr = local_180.m_next_ptr;
          local_160.m_control = local_180.m_control;
          local_160.m_queue = local_180.m_queue;
          local_180.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
                *)0x0;
          local_180.m_control = (ControlBlock *)0x0;
          local_180.m_next_ptr = 0;
          prVar6 = density::
                   lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                   ::consume_operation::complete_type((consume_operation *)&local_160);
          if (prVar6->m_feature_table !=
              (tuple_type *)
              density::detail::
              FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
              ::s_table) {
            __assert_fail("consume_2.complete_type().template is<int>()",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                          ,0x460,
                          "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_multiple, density::consistency_relaxed>::nonblocking_heterogeneous_queue_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple, CONSISTENCY_MODEL = density::consistency_relaxed]"
                         );
          }
          prVar6 = density::
                   lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                   ::consume_operation::complete_type((consume_operation *)&local_160);
          if (prVar6->m_feature_table !=
              (tuple_type *)
              density::detail::
              FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
              ::s_table) {
            __assert_fail("consume_2.complete_type() == runtime_type<>::make<int>()",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                          ,0x462,
                          "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_multiple, density::consistency_relaxed>::nonblocking_heterogeneous_queue_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple, CONSISTENCY_MODEL = density::consistency_relaxed]"
                         );
          }
          piVar7 = density::
                   lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                   ::consume_operation::element<int>((consume_operation *)&local_160);
          if (*piVar7 != 0x2a) {
            __assert_fail("consume_2.template element<int>() == 42",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                          ,0x463,
                          "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_multiple, density::consistency_relaxed>::nonblocking_heterogeneous_queue_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple, CONSISTENCY_MODEL = density::consistency_relaxed]"
                         );
          }
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          ::consume_operation::commit((consume_operation *)&local_160);
          bVar4 = density::
                  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                  ::empty((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                           *)&local_140);
          if (!bVar4) {
            __assert_fail("queue.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                          ,0x466,
                          "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_multiple, density::consistency_relaxed>::nonblocking_heterogeneous_queue_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple, CONSISTENCY_MODEL = density::consistency_relaxed]"
                         );
          }
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          ::consume_operation::~consume_operation((consume_operation *)&local_160);
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          ::consume_operation::~consume_operation((consume_operation *)&local_180);
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                             *)&local_140);
          local_140.
          super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
          .m_tail = 0xffc0;
          local_140.
          super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
          .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
          local_140.m_head._M_b._M_p = (__base_type)(__pointer_type)0x0;
          local_180.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
                *)CONCAT44(local_180.m_queue._4_4_,0x2a);
          density::
          lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>
          ::emplace<int,int>((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>
                              *)&local_140,(int *)&local_180);
          local_180.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
                *)0x0;
          local_180.m_control = (ControlBlock *)0x0;
          local_180.m_next_ptr = 0;
          density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
          ::Consume::start_consume_impl(&local_180,&local_140);
          piVar7 = (int *)density::
                          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                          ::consume_operation::unaligned_element_ptr
                                    ((consume_operation *)&local_180);
          piVar8 = (int *)density::
                          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                          ::consume_operation::element_ptr((consume_operation *)&local_180);
          if (piVar7 != piVar8) {
            __assert_fail("unaligned_ptr == consume.element_ptr()",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                          ,0x47f,
                          "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_multiple, density::consistency_relaxed>::nonblocking_heterogeneous_queue_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple, CONSISTENCY_MODEL = density::consistency_relaxed]"
                         );
          }
          if (((ulong)piVar7 & 3) != 0) {
            __assert_fail("address_is_aligned(element_ptr, alignof(int))",
                          "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                          ,0x482,
                          "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_multiple, density::consistency_relaxed>::nonblocking_heterogeneous_queue_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple, CONSISTENCY_MODEL = density::consistency_relaxed]"
                         );
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"An int: ",8);
          plVar9 = (long *)std::ostream::operator<<((ostream *)&std::cout,*piVar7);
          std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
          std::ostream::put((char)plVar9);
          std::ostream::flush();
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          ::consume_operation::commit((consume_operation *)&local_180);
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          ::consume_operation::~consume_operation((consume_operation *)&local_180);
          density::
          lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                             *)&local_140);
          local_140.
          super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
          .m_tail = 0xffc0;
          local_140.
          super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
          .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
          local_140.m_head._M_b._M_p = (__base_type)(__pointer_type)0x0;
          local_180.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
                *)CONCAT44(local_180.m_queue._4_4_,0x2a);
          density::
          lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>
          ::emplace<int,int>((lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>
                              *)&local_140,(int *)&local_180);
          local_180.m_queue =
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
                *)0x0;
          local_180.m_control = (ControlBlock *)0x0;
          local_180.m_next_ptr = 0;
          density::detail::
          LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
          ::Consume::start_consume_impl(&local_180,&local_140);
          prVar6 = density::
                   lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                   ::consume_operation::complete_type((consume_operation *)&local_180);
          if (prVar6->m_feature_table ==
              (tuple_type *)
              density::detail::
              FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,int>
              ::s_table) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"An int: ",8);
            piVar7 = density::
                     lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                     ::consume_operation::element<int>((consume_operation *)&local_180);
            plVar9 = (long *)std::ostream::operator<<((ostream *)&std::cout,*piVar7);
            std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
            std::ostream::put((char)plVar9);
            std::ostream::flush();
            density::
            lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
            ::consume_operation::commit((consume_operation *)&local_180);
            density::
            lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
            ::consume_operation::~consume_operation((consume_operation *)&local_180);
            density::
            lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
            ::~lf_heter_queue((lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                               *)&local_140);
            return;
          }
          __assert_fail("consume.complete_type().template is<int>()",
                        "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                        ,0x494,
                        "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_multiple, density::consistency_relaxed>::nonblocking_heterogeneous_queue_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple, CONSISTENCY_MODEL = density::consistency_relaxed]"
                       );
        }
      }
      __assert_fail("consume.empty() && !consume_1.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                    ,0x3ca,
                    "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_multiple, density::consistency_relaxed>::nonblocking_heterogeneous_queue_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple, CONSISTENCY_MODEL = density::consistency_relaxed]"
                   );
    }
  }
  __assert_fail("consume.empty() && !consume_1.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/lf_queue_examples.cpp"
                ,0x3b5,
                "static void density_tests::LfQueueSamples<density::concurrency_single, density::concurrency_multiple, density::consistency_relaxed>::nonblocking_heterogeneous_queue_consume_operation_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple, CONSISTENCY_MODEL = density::consistency_relaxed]"
               );
}

Assistant:

static void nonblocking_heterogeneous_queue_consume_operation_samples()
{
    using namespace density;

    {
        //! [lf_heter_queue consume_operation default_construct example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;

        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        typename LfQueue::consume_operation consume;
        assert(consume.empty());
        //! [lf_heter_queue consume_operation default_construct example 1]
    }

    //! [lf_heter_queue consume_operation copy_construct example 1]
    using LfQueue = lf_heter_queue<
      runtime_type<>,
      default_allocator,
      PROD_CARDINALITY,
      CONSUMER_CARDINALITY,
      CONSISTENCY_MODEL>;

    static_assert(!std::is_copy_constructible<typename LfQueue::consume_operation>::value, "");
    //! [lf_heter_queue consume_operation copy_construct example 1]

    //! [lf_heter_queue consume_operation copy_assign example 1]
    static_assert(!std::is_copy_assignable<typename LfQueue::consume_operation>::value, "");
    //! [lf_heter_queue consume_operation copy_assign example 1]

    {
        //! [lf_heter_queue consume_operation move_construct example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;

        queue.push(42);
        auto consume = queue.try_start_consume();

        auto consume_1 = std::move(consume);
        assert(consume.empty() && !consume_1.empty());
        consume_1.commit();
        //! [lf_heter_queue consume_operation move_construct example 1]
    }
    {
        //! [lf_heter_queue consume_operation move_assign example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;

        queue.push(42);
        queue.push(43);
        auto consume = queue.try_start_consume();

        typename LfQueue::consume_operation consume_1;
        consume_1 = std::move(consume);
        assert(consume.empty() && !consume_1.empty());
        consume_1.commit();
        //! [lf_heter_queue consume_operation move_assign example 1]
    }
    {
        //! [lf_heter_queue consume_operation destroy example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;

        queue.push(42);

        // this consumed is started and destroyed before being committed, so it has no observable effects
        queue.try_start_consume();
        //! [lf_heter_queue consume_operation destroy example 1]
    }
    {
        //! [lf_heter_queue consume_operation empty example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;
        queue.push(42);

        typename LfQueue::consume_operation consume;
        assert(consume.empty());
        consume = queue.try_start_consume();
        assert(!consume.empty());
        //! [lf_heter_queue consume_operation empty example 1]
    }
    {
        //! [lf_heter_queue consume_operation operator_bool example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;

        typename LfQueue::consume_operation consume;
        assert(consume.empty() == !consume);
        consume = queue.try_start_consume();
        assert(consume.empty() == !consume);
        //! [lf_heter_queue consume_operation operator_bool example 1]
    }
    {
        //! [lf_heter_queue consume_operation commit_nodestroy example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;
        queue.template emplace<std::string>("abc");

        typename LfQueue::consume_operation consume = queue.try_start_consume();
        consume.complete_type().destroy(consume.element_ptr());

        // the string has already been destroyed. Calling commit would trigger an undefined behavior
        consume.commit_nodestroy();
        //! [lf_heter_queue consume_operation commit_nodestroy example 1]
    }
    {
        //! [lf_heter_queue consume_operation cancel example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;
        queue.push(42);

        typename LfQueue::consume_operation consume = queue.try_start_consume();
        consume.cancel();

        // there is still a 42 in the queue
        assert(queue.try_start_consume().template element<int>() == 42);
        //! [lf_heter_queue consume_operation cancel example 1]
    }
    {
        //! [lf_heter_queue consume_operation complete_type example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;
        queue.push(42);

        typename LfQueue::consume_operation consume = queue.try_start_consume();
        assert(consume.complete_type().template is<int>());
        assert(
          consume.complete_type() == runtime_type<>::make<int>()); // same to the previous assert
        assert(consume.template element<int>() == 42);
        consume.commit();
        //! [lf_heter_queue consume_operation complete_type example 1]
    }
    {
        //! [lf_heter_queue consume_operation element_ptr example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;
        queue.push(42);

        typename LfQueue::consume_operation consume = queue.try_start_consume();
        ++*static_cast<int *>(consume.element_ptr());
        assert(consume.template element<int>() == 43);
        consume.commit();
        //! [lf_heter_queue consume_operation element_ptr example 1]
    }
    {
        //! [lf_heter_queue consume_operation swap example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;
        queue.push(42);

        typename LfQueue::consume_operation consume_1 = queue.try_start_consume();
        typename LfQueue::consume_operation consume_2;
        {
            using namespace std;
            swap(consume_1, consume_2);
        }
        assert(consume_2.complete_type().template is<int>());
        assert(
          consume_2.complete_type() == runtime_type<>::make<int>()); // same to the previous assert
        assert(consume_2.template element<int>() == 42);
        consume_2.commit();

        assert(queue.empty());
        //! [lf_heter_queue consume_operation swap example 1]
    }
    {
        //! [lf_heter_queue consume_operation unaligned_element_ptr example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;
        queue.push(42);

        typename LfQueue::consume_operation consume        = queue.try_start_consume();
        bool const                          is_overaligned = alignof(int) > LfQueue::min_alignment;
        void * const                        unaligned_ptr  = consume.unaligned_element_ptr();
        int *                               element_ptr;
        if (is_overaligned)
        {
            element_ptr = static_cast<int *>(address_upper_align(unaligned_ptr, alignof(int)));
        }
        else
        {
            assert(unaligned_ptr == consume.element_ptr());
            element_ptr = static_cast<int *>(unaligned_ptr);
        }
        assert(address_is_aligned(element_ptr, alignof(int)));
        std::cout << "An int: " << *element_ptr << std::endl;
        consume.commit();
        //! [lf_heter_queue consume_operation unaligned_element_ptr example 1]
    }
    {
        //! [lf_heter_queue consume_operation element example 1]
        using LfQueue = lf_heter_queue<
          runtime_type<>,
          default_allocator,
          PROD_CARDINALITY,
          CONSUMER_CARDINALITY,
          CONSISTENCY_MODEL>;

        LfQueue queue;
        queue.push(42);

        typename LfQueue::consume_operation consume = queue.try_start_consume();
        assert(consume.complete_type().template is<int>());
        std::cout << "An int: " << consume.template element<int>() << std::endl;
        /* std::cout << "An float: " << consume.element<float>() << std::endl; this would
                trigger an undefined behavior, because the element is not a float */
        consume.commit();
        //! [lf_heter_queue consume_operation element example 1]
    }
}